

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O0

TriStateResult __thiscall QFSFileEngine::cloneTo(QFSFileEngine *this,QAbstractFileEngine *target)

{
  bool bVar1;
  QFlags<QAbstractFileEngine::FileFlag> QVar2;
  int iVar3;
  int iVar4;
  QAbstractFileEngine *in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  TriStateResult r;
  int dstfd;
  int srcfd;
  QFSFileEnginePrivate *d;
  FileFlag in_stack_ffffffffffffff6c;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  FileError error;
  QAbstractFileEngine *this_00;
  undefined8 uVar5;
  TriStateResult local_31;
  CompareAgainstLiteralZero local_11;
  uint local_10;
  int local_c;
  long local_8;
  
  error = (FileError)((ulong)in_RDI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QFSFileEngine *)0x173615);
  this_00 = in_RSI;
  QFlags<QAbstractFileEngine::FileFlag>::QFlags
            ((QFlags<QAbstractFileEngine::FileFlag> *)
             CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),in_stack_ffffffffffffff6c
            );
  local_c = (*this_00->_vptr_QAbstractFileEngine[0x16])(this_00,(ulong)local_10);
  QVar2 = QFlags<QAbstractFileEngine::FileFlag>::operator&
                    ((QFlags<QAbstractFileEngine::FileFlag> *)
                     CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                     in_stack_ffffffffffffff6c);
  uVar5 = 0;
  QtPrivate::CompareAgainstLiteralZero::CompareAgainstLiteralZero(&local_11,0);
  bVar1 = ::operator==(QVar2.super_QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4>.
                       super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i);
  if (bVar1) {
    local_31 = NotSupported;
  }
  else {
    iVar3 = QFSFileEnginePrivate::nativeHandle
                      ((QFSFileEnginePrivate *)
                       CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    iVar4 = (*in_RSI->_vptr_QAbstractFileEngine[0x1f])();
    local_31 = QFileSystemEngine::cloneFile
                         ((int)((ulong)uVar5 >> 0x20),(int)uVar5,
                          (QFileSystemMetaData *)CONCAT44(iVar3,iVar4));
    if (local_31 == Failed) {
      __errno_location();
      qt_error_string(error);
      QAbstractFileEngine::setError
                (this_00,error,
                 (QString *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
      QString::~QString((QString *)0x17371d);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_31;
}

Assistant:

QAbstractFileEngine::TriStateResult QFSFileEngine::cloneTo(QAbstractFileEngine *target)
{
    Q_D(QFSFileEngine);
    if ((target->fileFlags(LocalDiskFlag) & LocalDiskFlag) == 0)
        return TriStateResult::NotSupported;

    int srcfd = d->nativeHandle();
    int dstfd = target->handle();
    TriStateResult r = QFileSystemEngine::cloneFile(srcfd, dstfd, d->metaData);
    if (r == TriStateResult::Failed)
        setError(QFile::CopyError, qt_error_string(errno));
    return r;
}